

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

bool operator<(QSettingsIniKey *k1,QSettingsIniKey *k2)

{
  strong_ordering sVar1;
  
  if (k1->position != k2->position) {
    return k1->position < k2->position;
  }
  sVar1 = compareThreeWay(&k1->super_QString,&k2->super_QString);
  return (bool)((byte)sVar1.m_order >> 7);
}

Assistant:

static bool operator<(const QSettingsIniKey &k1, const QSettingsIniKey &k2)
{
    if (k1.position != k2.position)
        return k1.position < k2.position;
    return static_cast<const QString &>(k1) < static_cast<const QString &>(k2);
}